

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImVector<ImDrawCmd> *in_RDI;
  int in_stack_ffffffffffffffec;
  
  ImVector<ImDrawCmd>::resize(in_RDI,in_stack_ffffffffffffffec);
  ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)in_RDI,in_stack_ffffffffffffffec);
  ImVector<ImDrawVert>::resize((ImVector<ImDrawVert> *)in_RDI,in_stack_ffffffffffffffec);
  in_RDI[3].Size = 3;
  *(undefined4 *)&in_RDI[4].Data = 0;
  in_RDI[5].Size = 0;
  in_RDI[5].Capacity = 0;
  in_RDI[5].Data = (ImDrawCmd *)0x0;
  ImVector<ImVec4>::resize((ImVector<ImVec4> *)in_RDI,in_stack_ffffffffffffffec);
  ImVector<void_*>::resize((ImVector<void_*> *)in_RDI,in_stack_ffffffffffffffec);
  ImVector<ImVec2>::resize((ImVector<ImVec2> *)in_RDI,in_stack_ffffffffffffffec);
  in_RDI[9].Size = 0;
  in_RDI[9].Capacity = 1;
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = ImDrawListFlags_AntiAliasedLines | ImDrawListFlags_AntiAliasedFill;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    // NB: Do not clear channels so our allocations are re-used after the first frame.
}